

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

mecab_node_t * __thiscall MeCab::FreeList<mecab_node_t>::alloc(FreeList<mecab_node_t> *this)

{
  mecab_node_t *pmVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  pointer ppmVar5;
  mecab_node_t *local_18;
  
  uVar4 = this->pi_;
  sVar3 = this->li_;
  if (uVar4 == this->size) {
    sVar3 = sVar3 + 1;
    this->li_ = sVar3;
    this->pi_ = 0;
    uVar4 = 0;
  }
  ppmVar5 = (this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (sVar3 == (long)(this->freeList).
                     super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppmVar5 >> 3) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->size;
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x70),8) == 0) {
      uVar4 = SUB168(auVar2 * ZEXT816(0x70),0);
    }
    local_18 = (mecab_node_t *)operator_new__(uVar4);
    std::vector<mecab_node_t*,std::allocator<mecab_node_t*>>::emplace_back<mecab_node_t*>
              ((vector<mecab_node_t*,std::allocator<mecab_node_t*>> *)&this->freeList,&local_18);
    sVar3 = this->li_;
    ppmVar5 = (this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar4 = this->pi_;
  }
  pmVar1 = ppmVar5[sVar3];
  this->pi_ = uVar4 + 1;
  return pmVar1 + uVar4;
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }